

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int lnewconf(lua_State *L)

{
  char *s;
  char *error;
  size_t sz;
  table *tbl;
  context ctx;
  int ret;
  lua_State *L_local;
  
  sz = 0;
  luaL_checktype(L,1,5);
  tbl = (table *)luaL_newstate();
  ctx.L = (lua_State *)0x0;
  ctx.tbl._0_4_ = 1;
  if ((lua_State *)tbl == (lua_State *)0x0) {
    lua_pushstring(L,"memory error");
  }
  else {
    sz = (size_t)malloc(0x28);
    if ((void *)sz == (void *)0x0) {
      lua_close((lua_State *)tbl);
      tbl = (table *)0x0;
      lua_pushstring(L,"memory error");
    }
    else {
      memset((void *)sz,0,0x28);
      ctx.L = (lua_State *)sz;
      lua_pushcclosure((lua_State *)tbl,pconv,0);
      lua_pushlightuserdata((lua_State *)tbl,&tbl);
      lua_pushlightuserdata((lua_State *)tbl,L);
      ctx._20_4_ = lua_pcallk((lua_State *)tbl,2,1,0,0,(lua_KFunction)0x0);
      if (ctx._20_4_ == 0) {
        convert_stringmap((context *)&tbl,(table *)sz);
        lua_pushlightuserdata(L,(void *)sz);
        return 1;
      }
      error = (char *)0x0;
      s = lua_tolstring((lua_State *)tbl,-1,(size_t *)&error);
      lua_pushlstring(L,s,(size_t)error);
    }
  }
  if (tbl != (table *)0x0) {
    lua_close((lua_State *)tbl);
  }
  if (sz != 0) {
    delete_tbl((table *)sz);
  }
  lua_error(L);
  return -1;
}

Assistant:

static int
lnewconf(lua_State *L) {
	int ret;
	struct context ctx;
	struct table * tbl = NULL;
	luaL_checktype(L,1,LUA_TTABLE);
	ctx.L = luaL_newstate();
	ctx.tbl = NULL;
	ctx.string_index = 1;	// 1 reserved for dirty flag
	if (ctx.L == NULL) {
		lua_pushliteral(L, "memory error");
		goto error;
	}
	tbl = (struct table *)malloc(sizeof(struct table));
	if (tbl == NULL) {
		// lua_pushliteral may fail because of memory error, close first.
		lua_close(ctx.L);
		ctx.L = NULL;
		lua_pushliteral(L, "memory error");
		goto error;
	}
	memset(tbl, 0, sizeof(struct table));
	ctx.tbl = tbl;

	lua_pushcfunction(ctx.L, pconv);
	lua_pushlightuserdata(ctx.L , &ctx);
	lua_pushlightuserdata(ctx.L , L);

	ret = lua_pcall(ctx.L, 2, 1, 0);

	if (ret != LUA_OK) {
		size_t sz = 0;
		const char * error = lua_tolstring(ctx.L, -1, &sz);
		lua_pushlstring(L, error, sz);
		goto error;
	}

	convert_stringmap(&ctx, tbl);

	lua_pushlightuserdata(L, tbl);	

	return 1;
error:
	if (ctx.L) {
		lua_close(ctx.L);
	}
	if (tbl) {
		delete_tbl(tbl);
	}
	lua_error(L);
	return -1;
}